

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int64_t rd_pick_intrabc_mode_sb
                  (AV1_COMP *cpi,MACROBLOCK *x,PICK_MODE_CONTEXT *ctx,RD_STATS *rd_stats,
                  BLOCK_SIZE bsize,int64_t best_rd)

{
  undefined8 uVar1;
  int iVar2;
  int mode_rate;
  int iVar3;
  MV MVar4;
  FULLPEL_MV mv;
  int iVar5;
  int_interpfilters iVar6;
  int iVar7;
  MV *mv_00;
  void *in_RCX;
  long lVar8;
  long in_RDX;
  long lVar9;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  byte in_R8B;
  FULLPEL_MOTION_SEARCH_PARAMS *in_R9;
  uint8_t *puVar10;
  TileInfo *tile_00;
  RD_STATS rd_stats_uv;
  RD_STATS rd_stats_y;
  RD_STATS rd_stats_yuv;
  int rate_mode;
  int rate_mv;
  MV dv;
  int hashsme;
  int bestsme;
  FULLPEL_MV_STATS best_mv_stats;
  int_mv best_hash_mv;
  int_mv best_mv;
  IntraBCHashInfo *intrabc_hash_info;
  int step_param;
  int bottom_coded_mi_edge;
  IntrabcMotionDirection dir;
  IntraBCMVCosts *dv_costs;
  FULLPEL_MV start_mv;
  search_site_config *lookahead_search_sites;
  SEARCH_METHODS search_method;
  FULLPEL_MOTION_SEARCH_PARAMS fullms_params;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  RD_STATS best_rdstats;
  MB_MODE_INFO best_mbmi;
  int i;
  buf_2d yv12_mb [3];
  int_mv dv_ref;
  int_mv nearmv;
  int_mv nearestmv;
  MV_REFERENCE_FRAME ref_frame;
  MB_MODE_INFO_EXT *mbmi_ext;
  int sb_col;
  int sb_row;
  int h;
  int w;
  int mi_col;
  int mi_row;
  TxfmSearchInfo *txfm_info;
  MB_MODE_INFO *mbmi;
  TileInfo *tile;
  MACROBLOCKD *xd;
  int num_planes;
  AV1_COMMON *cm;
  uint uVar12;
  ulong uVar11;
  int **mvcost;
  AV1_COMMON *in_stack_fffffffffffff400;
  int_mv *ref_dv;
  undefined4 uVar13;
  int *mvjcost;
  MV *ref_mv;
  undefined4 in_stack_fffffffffffff418;
  int in_stack_fffffffffffff41c;
  int_mv *in_stack_fffffffffffff420;
  qm_val_t *pqVar14;
  int_mv *in_stack_fffffffffffff428;
  undefined8 in_stack_fffffffffffff430;
  MV_REFERENCE_FRAME ref_frame_00;
  MACROBLOCKD *pMVar15;
  undefined4 in_stack_fffffffffffff438;
  undefined4 in_stack_fffffffffffff43c;
  int mi_col_00;
  int in_stack_fffffffffffff444;
  MACROBLOCKD *xd_00;
  int in_stack_fffffffffffff450;
  uint uVar16;
  int in_stack_fffffffffffff460;
  int in_stack_fffffffffffff464;
  int in_stack_fffffffffffff468;
  int in_stack_fffffffffffff46c;
  MACROBLOCKD *in_stack_fffffffffffff470;
  AV1_COMMON *in_stack_fffffffffffff478;
  MV in_stack_fffffffffffff480;
  undefined4 in_stack_fffffffffffff484;
  BLOCK_SIZE BVar17;
  MACROBLOCK *in_stack_fffffffffffff488;
  int in_stack_fffffffffffff490;
  undefined4 in_stack_fffffffffffff494;
  undefined7 in_stack_fffffffffffff498;
  MV_REFERENCE_FRAME in_stack_fffffffffffff49f;
  undefined4 in_stack_fffffffffffff4a0;
  FULLPEL_MV in_stack_fffffffffffff4a4;
  int in_stack_fffffffffffff4a8;
  undefined4 in_stack_fffffffffffff4ac;
  AV1_COMMON *in_stack_fffffffffffff4b0;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffff4b8;
  int in_stack_fffffffffffff4c0;
  undefined4 in_stack_fffffffffffff4c4;
  AV1_COMP *in_stack_fffffffffffff4c8;
  undefined4 in_stack_fffffffffffff4d0;
  undefined4 in_stack_fffffffffffff4d4;
  undefined4 in_stack_fffffffffffff4d8;
  undefined4 in_stack_fffffffffffff4dc;
  MV in_stack_fffffffffffff4e0;
  undefined4 in_stack_fffffffffffff4e4;
  undefined4 in_stack_fffffffffffff4e8;
  undefined4 in_stack_fffffffffffff4ec;
  FULLPEL_MV local_b04;
  undefined4 in_stack_fffffffffffff508;
  undefined4 uVar18;
  uint local_aec;
  FULLPEL_MV_STATS *in_stack_fffffffffffff568;
  FULLPEL_MV *in_stack_fffffffffffff570;
  int *in_stack_fffffffffffff578;
  int in_stack_fffffffffffff584;
  search_site_config *in_stack_fffffffffffff588;
  FULLPEL_MV in_stack_fffffffffffff590;
  int local_a6c;
  int local_a68;
  int local_a64;
  FULLPEL_MV *in_stack_fffffffffffff5a0;
  int local_10c;
  MV local_a0;
  MV local_9c;
  MV local_98;
  undefined1 local_91;
  MB_MODE_INFO_EXT *local_90;
  int local_88;
  int local_84;
  uint local_80;
  uint local_7c;
  int local_78;
  int local_74;
  qm_val_t *local_70;
  qm_val_t *local_68;
  int *local_60;
  MACROBLOCKD *local_58;
  int local_4c;
  AV1_COMMON *local_48;
  FULLPEL_MOTION_SEARCH_PARAMS *local_40;
  byte local_31;
  void *local_30;
  long local_28;
  uint8_t *local_20;
  uint8_t *local_18;
  FULLPEL_MOTION_SEARCH_PARAMS *local_10;
  
  ref_frame_00 = (MV_REFERENCE_FRAME)((ulong)in_stack_fffffffffffff430 >> 0x38);
  local_48 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  local_40 = in_R9;
  local_31 = in_R8B;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  iVar2 = av1_allow_intrabc(in_stack_fffffffffffff400);
  if ((((iVar2 == 0) || ((local_18[0x4238a] & 1) == 0)) || (*(int *)(local_18 + 0x60a58) == 0)) ||
     (*(int *)(local_18 + 0x60cb0) != 0)) {
    local_10 = (FULLPEL_MOTION_SEARCH_PARAMS *)0x7fffffffffffffff;
  }
  else {
    local_4c = av1_num_planes(local_48);
    local_58 = (MACROBLOCKD *)(local_20 + 0x1a0);
    local_60 = (int *)(local_20 + 0x2040);
    local_68 = (qm_val_t *)**(undefined8 **)(local_20 + 0x2058);
    local_70 = local_20 + 0x24e08;
    local_74 = local_58->mi_row;
    local_78 = *(int *)(local_20 + 0x1a4);
    local_7c = (uint)block_size_wide[local_31];
    local_80 = (uint)block_size_high[local_31];
    local_84 = local_74 >> ((byte)local_48->seq_params->mib_size_log2 & 0x1f);
    local_88 = local_78 >> ((byte)local_48->seq_params->mib_size_log2 & 0x1f);
    local_90 = (MB_MODE_INFO_EXT *)(local_20 + 0x3c70);
    local_91 = 0;
    tile_00 = (TileInfo *)(local_20 + 0x2958);
    puVar10 = local_20 + 0x4118;
    mv_00 = (MV *)(local_20 + 0x4138);
    ref_dv = (int_mv *)0x0;
    av1_find_mv_refs(in_stack_fffffffffffff4b0,
                     (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8),
                     (MB_MODE_INFO *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                     in_stack_fffffffffffff49f,
                     (uint8_t *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                     (CANDIDATE_MV (*) [8])in_stack_fffffffffffff488,
                     (uint16_t (*) [8])CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0)
                     ,(int_mv (*) [2])CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8),
                     (int_mv *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
                     (int16_t *)CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8));
    av1_copy_usable_ref_mv_stack_and_weight(local_58,local_90,'\0');
    av1_find_best_ref_mvs_from_stack
              (in_stack_fffffffffffff444,
               (MB_MODE_INFO_EXT *)CONCAT44(in_stack_fffffffffffff43c,in_stack_fffffffffffff438),
               ref_frame_00,in_stack_fffffffffffff428,in_stack_fffffffffffff420,
               in_stack_fffffffffffff41c);
    if (local_98 == (MV)0x80008000) {
      local_98.row = 0;
      local_98.col = 0;
    }
    if (local_9c == (MV)0x80008000) {
      local_9c.row = 0;
      local_9c.col = 0;
    }
    if (local_98 == (MV)0x0) {
      local_a0 = local_9c;
    }
    else {
      local_a0 = local_98;
    }
    if (local_a0 == (MV)0x0) {
      av1_find_ref_dv(ref_dv,tile_00,0,0x2df8c8);
    }
    uVar16 = (uint)((ulong)ref_dv >> 0x20);
    local_90->ref_mv_stack[0][0].this_mv.as_int = (uint32_t)local_a0;
    av1_setup_pred_block
              ((MACROBLOCKD *)in_stack_fffffffffffff488,
               (buf_2d *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
               (YV12_BUFFER_CONFIG *)in_stack_fffffffffffff478,
               (scale_factors *)in_stack_fffffffffffff470,
               (scale_factors *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
               in_stack_fffffffffffff464);
    BVar17 = (BLOCK_SIZE)((uint)in_stack_fffffffffffff484 >> 0x18);
    for (local_10c = 0; local_10c < local_4c; local_10c = local_10c + 1) {
      lVar8 = (long)local_10c;
      lVar9 = (long)local_10c * 0x20;
      local_58->plane[lVar8].pre[0].buf = *(uint8_t **)(&stack0xfffffffffffffef8 + lVar9);
      local_58->plane[lVar8].pre[0].buf0 = *(uint8_t **)(&stack0xffffffffffffff00 + lVar9);
      uVar1 = *(undefined8 *)(&stack0xffffffffffffff08 + lVar9);
      local_58->plane[lVar8].pre[0].width = (int)uVar1;
      local_58->plane[lVar8].pre[0].height = (int)((ulong)uVar1 >> 0x20);
      *(undefined8 *)&local_58->plane[lVar8].pre[0].stride =
           *(undefined8 *)(&stack0xffffffffffffff10 + lVar9);
    }
    memcpy(&stack0xfffffffffffffe40,local_68,0xb0);
    memcpy(&stack0xfffffffffffffe18,local_30,0x28);
    memset(&stack0xfffffffffffffa18,0,0x400);
    memcpy(&stack0xfffffffffffff618,local_58->tx_type_map,(long)*(int *)(local_28 + 0x1a0));
    av1_get_default_mv_search_method
              ((MACROBLOCK *)&in_stack_fffffffffffff420->as_mv,
               (MV_SPEED_FEATURES *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
               (BLOCK_SIZE)((ulong)mv_00 >> 0x38));
    get_fullmv_from_mv(&local_a0);
    lVar8 = (ulong)uVar16 << 0x20;
    ref_mv = (MV *)((ulong)puVar10 & 0xffffffff00000000);
    av1_make_default_fullpel_ms_params
              ((FULLPEL_MOTION_SEARCH_PARAMS *)
               CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),
               (AV1_COMP *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               in_stack_fffffffffffff488,BVar17,(MV *)in_stack_fffffffffffff478,
               in_stack_fffffffffffff4a4,(search_site_config *)in_stack_fffffffffffff4b0,
               (SEARCH_METHODS)in_stack_fffffffffffff4b8,in_stack_fffffffffffff4c0);
    av1_set_ms_to_intra_mode
              ((FULLPEL_MOTION_SEARCH_PARAMS *)&stack0xfffffffffffff538,
               *(IntraBCMVCosts **)(local_20 + 0xb9d0));
    for (local_aec = 0; local_aec < 2; local_aec = local_aec + 1) {
      if (local_aec == 0) {
        in_stack_fffffffffffff590 = (FULLPEL_MV)((local_60[2] - local_78) * 4);
        local_a6c = (local_60[3] - local_78) * 4 - local_7c;
        local_a68 = (*local_60 - local_74) * 4;
        local_a64 = (local_84 * local_48->seq_params->mib_size - local_74) * 4 - local_80;
      }
      else if (local_aec == 1) {
        in_stack_fffffffffffff590 = (FULLPEL_MV)((local_60[2] - local_78) * 4);
        local_a6c = (local_88 * local_48->seq_params->mib_size - local_78) * 4 - local_7c;
        local_a68 = (*local_60 - local_74) * 4;
        if ((local_84 + 1) * local_48->seq_params->mib_size < local_60[1]) {
          in_stack_fffffffffffff450 = (local_84 + 1) * local_48->seq_params->mib_size;
        }
        else {
          in_stack_fffffffffffff450 = local_60[1];
        }
        local_a64 = (in_stack_fffffffffffff450 - local_74) * 4 - local_80;
      }
      uVar16 = local_aec;
      av1_set_mv_search_range((FullMvLimits *)&stack0xfffffffffffff590,&local_a0);
      if (((int)in_stack_fffffffffffff590 <= local_a6c) && (local_a68 <= local_a64)) {
        uVar18 = *(undefined4 *)(local_18 + 0x60dfc);
        mode_rate = (int)local_20 + 0x1ee58;
        uVar12 = 0;
        iVar2 = av1_full_pixel_search
                          (in_stack_fffffffffffff590,
                           (FULLPEL_MOTION_SEARCH_PARAMS *)in_stack_fffffffffffff588,
                           in_stack_fffffffffffff584,in_stack_fffffffffffff578,
                           in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                           in_stack_fffffffffffff5a0);
        iVar3 = av1_intrabc_hash_search
                          (in_stack_fffffffffffff4c8,
                           (MACROBLOCKD *)
                           CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
                           in_stack_fffffffffffff4b8,(IntraBCHashInfo *)in_stack_fffffffffffff4b0,
                           (FULLPEL_MV *)
                           CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
        if (iVar3 < iVar2) {
          iVar2 = iVar3;
        }
        if (iVar2 != 0x7fffffff) {
          MVar4 = get_mv_from_fullmv(&local_b04);
          xd_00 = (MACROBLOCKD *)&stack0xfffffffffffff590;
          mv = get_fullmv_from_mv((MV *)&stack0xfffffffffffff4e0);
          iVar5 = av1_is_fullmv_in_range((FullMvLimits *)xd_00,mv);
          BVar17 = mv.col._1_1_;
          if (iVar5 != 0) {
            uVar11 = (ulong)uVar12 << 0x20;
            iVar5 = av1_is_dv_valid(in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                                    in_stack_fffffffffffff470,in_stack_fffffffffffff46c,
                                    in_stack_fffffffffffff468,
                                    (BLOCK_SIZE)((uint)in_stack_fffffffffffff464 >> 0x18),
                                    in_stack_fffffffffffff490);
            uVar13 = (undefined4)((ulong)lVar8 >> 0x20);
            if (iVar5 != 0) {
              memset(local_68 + 0x5e,0,0x32);
              local_68[0x5b] = '\0';
              *(ushort *)(local_68 + 0xa7) = *(ushort *)(local_68 + 0xa7) & 0xff7f | 0x80;
              local_68[2] = '\0';
              local_68[3] = '\0';
              local_68[0x18] = '\0';
              *(MV *)(local_68 + 8) = MVar4;
              pqVar14 = local_68;
              iVar6 = av1_broadcast_interp_filter(BILINEAR);
              *(int_interpfilters *)(pqVar14 + 0x14) = iVar6;
              local_68[0x90] = '\0';
              in_stack_fffffffffffff444 = CONCAT13(local_31,(int3)in_stack_fffffffffffff444);
              pMVar15 = local_58;
              iVar5 = local_74;
              mi_col_00 = local_78;
              iVar7 = av1_num_planes(local_48);
              mvcost = (int **)(uVar11 & 0xffffffff00000000);
              mvjcost = (int *)CONCAT44(uVar13,iVar7 + -1);
              av1_enc_build_inter_predictor
                        ((AV1_COMMON *)CONCAT44(uVar16,in_stack_fffffffffffff450),xd_00,
                         in_stack_fffffffffffff444,mi_col_00,
                         (BUFFER_SET *)CONCAT44(iVar5,in_stack_fffffffffffff438),
                         (BLOCK_SIZE)((ulong)pMVar15 >> 0x38),in_stack_fffffffffffff460,
                         in_stack_fffffffffffff468);
              iVar5 = av1_mv_bit_cost(mv_00,ref_mv,mvjcost,mvcost,0);
              lVar8 = 0x7fffffffffffffff;
              iVar2 = av1_txfm_search((AV1_COMP *)CONCAT44(in_stack_fffffffffffff4ec,iVar2),
                                      (MACROBLOCK *)CONCAT44(iVar3,MVar4),BVar17,
                                      (RD_STATS *)CONCAT44(iVar5,*(undefined4 *)(local_20 + 0x73cc))
                                      ,(RD_STATS *)in_stack_fffffffffffff4c8,
                                      (RD_STATS *)
                                      CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
                                      mode_rate,CONCAT44(uVar18,in_stack_fffffffffffff508));
              if ((iVar2 != 0) &&
                 (in_stack_fffffffffffff4b8 =
                       (FULLPEL_MOTION_SEARCH_PARAMS *)
                       (((long)in_stack_fffffffffffff4a8 * (long)*(int *)(local_20 + 0x4218) + 0x100
                        >> 9) + (long)in_stack_fffffffffffff4b0 * 0x80),
                 (long)in_stack_fffffffffffff4b8 < (long)local_40)) {
                local_40 = in_stack_fffffffffffff4b8;
                memcpy(&stack0xfffffffffffffe40,local_68,0xb0);
                memcpy(&stack0xfffffffffffffe18,&stack0xfffffffffffff4a8,0x28);
                memcpy(&stack0xfffffffffffffa18,local_70 + 1,
                       (ulong)local_58->height * (ulong)local_58->width);
                memcpy(&stack0xfffffffffffff618,local_58->tx_type_map,
                       (long)(int)((uint)local_58->height * (uint)local_58->width));
              }
            }
          }
        }
      }
    }
    memcpy(local_68,&stack0xfffffffffffffe40,0xb0);
    memcpy(local_30,&stack0xfffffffffffffe18,0x28);
    memcpy(local_70 + 1,&stack0xfffffffffffffa18,(ulong)local_58->height * (ulong)local_58->width);
    memcpy(local_58->tx_type_map,&stack0xfffffffffffff618,(long)*(int *)(local_28 + 0x1a0));
    local_10 = local_40;
  }
  return (int64_t)local_10;
}

Assistant:

static int64_t rd_pick_intrabc_mode_sb(const AV1_COMP *cpi, MACROBLOCK *x,
                                       PICK_MODE_CONTEXT *ctx,
                                       RD_STATS *rd_stats, BLOCK_SIZE bsize,
                                       int64_t best_rd) {
  const AV1_COMMON *const cm = &cpi->common;
  if (!av1_allow_intrabc(cm) || !cpi->oxcf.kf_cfg.enable_intrabc ||
      !cpi->sf.mv_sf.use_intrabc || cpi->sf.rt_sf.use_nonrd_pick_mode)
    return INT64_MAX;
  const int num_planes = av1_num_planes(cm);

  MACROBLOCKD *const xd = &x->e_mbd;
  const TileInfo *tile = &xd->tile;
  MB_MODE_INFO *mbmi = xd->mi[0];
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int w = block_size_wide[bsize];
  const int h = block_size_high[bsize];
  const int sb_row = mi_row >> cm->seq_params->mib_size_log2;
  const int sb_col = mi_col >> cm->seq_params->mib_size_log2;

  MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  const MV_REFERENCE_FRAME ref_frame = INTRA_FRAME;
  av1_find_mv_refs(cm, xd, mbmi, ref_frame, mbmi_ext->ref_mv_count,
                   xd->ref_mv_stack, xd->weight, NULL, mbmi_ext->global_mvs,
                   mbmi_ext->mode_context);
  // TODO(Ravi): Populate mbmi_ext->ref_mv_stack[ref_frame][4] and
  // mbmi_ext->weight[ref_frame][4] inside av1_find_mv_refs.
  av1_copy_usable_ref_mv_stack_and_weight(xd, mbmi_ext, ref_frame);
  int_mv nearestmv, nearmv;
  av1_find_best_ref_mvs_from_stack(0, mbmi_ext, ref_frame, &nearestmv, &nearmv,
                                   0);

  if (nearestmv.as_int == INVALID_MV) {
    nearestmv.as_int = 0;
  }
  if (nearmv.as_int == INVALID_MV) {
    nearmv.as_int = 0;
  }

  int_mv dv_ref = nearestmv.as_int == 0 ? nearmv : nearestmv;
  if (dv_ref.as_int == 0) {
    av1_find_ref_dv(&dv_ref, tile, cm->seq_params->mib_size, mi_row);
  }
  // Ref DV should not have sub-pel.
  assert((dv_ref.as_mv.col & 7) == 0);
  assert((dv_ref.as_mv.row & 7) == 0);
  mbmi_ext->ref_mv_stack[INTRA_FRAME][0].this_mv = dv_ref;

  struct buf_2d yv12_mb[MAX_MB_PLANE];
  av1_setup_pred_block(xd, yv12_mb, xd->cur_buf, NULL, NULL, num_planes);
  for (int i = 0; i < num_planes; ++i) {
    xd->plane[i].pre[0] = yv12_mb[i];
  }

  enum IntrabcMotionDirection {
    IBC_MOTION_ABOVE,
    IBC_MOTION_LEFT,
    IBC_MOTION_DIRECTIONS
  };

  MB_MODE_INFO best_mbmi = *mbmi;
  RD_STATS best_rdstats = *rd_stats;
  uint8_t best_blk_skip[MAX_MIB_SIZE * MAX_MIB_SIZE] = { 0 };
  uint8_t best_tx_type_map[MAX_MIB_SIZE * MAX_MIB_SIZE];
  av1_copy_array(best_tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);

  FULLPEL_MOTION_SEARCH_PARAMS fullms_params;
  const SEARCH_METHODS search_method =
      av1_get_default_mv_search_method(x, &cpi->sf.mv_sf, bsize);
  const search_site_config *lookahead_search_sites =
      cpi->mv_search_params.search_site_cfg[SS_CFG_LOOKAHEAD];
  const FULLPEL_MV start_mv = get_fullmv_from_mv(&dv_ref.as_mv);
  av1_make_default_fullpel_ms_params(&fullms_params, cpi, x, bsize,
                                     &dv_ref.as_mv, start_mv,
                                     lookahead_search_sites, search_method,
                                     /*fine_search_interval=*/0);
  const IntraBCMVCosts *const dv_costs = x->dv_costs;
  av1_set_ms_to_intra_mode(&fullms_params, dv_costs);

  for (enum IntrabcMotionDirection dir = IBC_MOTION_ABOVE;
       dir < IBC_MOTION_DIRECTIONS; ++dir) {
    switch (dir) {
      case IBC_MOTION_ABOVE:
        fullms_params.mv_limits.col_min =
            (tile->mi_col_start - mi_col) * MI_SIZE;
        fullms_params.mv_limits.col_max =
            (tile->mi_col_end - mi_col) * MI_SIZE - w;
        fullms_params.mv_limits.row_min =
            (tile->mi_row_start - mi_row) * MI_SIZE;
        fullms_params.mv_limits.row_max =
            (sb_row * cm->seq_params->mib_size - mi_row) * MI_SIZE - h;
        break;
      case IBC_MOTION_LEFT:
        fullms_params.mv_limits.col_min =
            (tile->mi_col_start - mi_col) * MI_SIZE;
        fullms_params.mv_limits.col_max =
            (sb_col * cm->seq_params->mib_size - mi_col) * MI_SIZE - w;
        // TODO(aconverse@google.com): Minimize the overlap between above and
        // left areas.
        fullms_params.mv_limits.row_min =
            (tile->mi_row_start - mi_row) * MI_SIZE;
        int bottom_coded_mi_edge =
            AOMMIN((sb_row + 1) * cm->seq_params->mib_size, tile->mi_row_end);
        fullms_params.mv_limits.row_max =
            (bottom_coded_mi_edge - mi_row) * MI_SIZE - h;
        break;
      default: assert(0);
    }
    assert(fullms_params.mv_limits.col_min >= fullms_params.mv_limits.col_min);
    assert(fullms_params.mv_limits.col_max <= fullms_params.mv_limits.col_max);
    assert(fullms_params.mv_limits.row_min >= fullms_params.mv_limits.row_min);
    assert(fullms_params.mv_limits.row_max <= fullms_params.mv_limits.row_max);

    av1_set_mv_search_range(&fullms_params.mv_limits, &dv_ref.as_mv);

    if (fullms_params.mv_limits.col_max < fullms_params.mv_limits.col_min ||
        fullms_params.mv_limits.row_max < fullms_params.mv_limits.row_min) {
      continue;
    }

    const int step_param = cpi->mv_search_params.mv_step_param;
    IntraBCHashInfo *intrabc_hash_info = &x->intrabc_hash_info;
    int_mv best_mv, best_hash_mv;
    FULLPEL_MV_STATS best_mv_stats;

    int bestsme =
        av1_full_pixel_search(start_mv, &fullms_params, step_param, NULL,
                              &best_mv.as_fullmv, &best_mv_stats, NULL);
    const int hashsme = av1_intrabc_hash_search(
        cpi, xd, &fullms_params, intrabc_hash_info, &best_hash_mv.as_fullmv);
    if (hashsme < bestsme) {
      best_mv = best_hash_mv;
      bestsme = hashsme;
    }

    if (bestsme == INT_MAX) continue;
    const MV dv = get_mv_from_fullmv(&best_mv.as_fullmv);
    if (!av1_is_fullmv_in_range(&fullms_params.mv_limits,
                                get_fullmv_from_mv(&dv)))
      continue;
    if (!av1_is_dv_valid(dv, cm, xd, mi_row, mi_col, bsize,
                         cm->seq_params->mib_size_log2))
      continue;

    // DV should not have sub-pel.
    assert((dv.col & 7) == 0);
    assert((dv.row & 7) == 0);
    memset(&mbmi->palette_mode_info, 0, sizeof(mbmi->palette_mode_info));
    mbmi->filter_intra_mode_info.use_filter_intra = 0;
    mbmi->use_intrabc = 1;
    mbmi->mode = DC_PRED;
    mbmi->uv_mode = UV_DC_PRED;
    mbmi->motion_mode = SIMPLE_TRANSLATION;
    mbmi->mv[0].as_mv = dv;
    mbmi->interp_filters = av1_broadcast_interp_filter(BILINEAR);
    mbmi->skip_txfm = 0;
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize, 0,
                                  av1_num_planes(cm) - 1);

    // TODO(aconverse@google.com): The full motion field defining discount
    // in MV_COST_WEIGHT is too large. Explore other values.
    const int rate_mv = av1_mv_bit_cost(&dv, &dv_ref.as_mv, dv_costs->joint_mv,
                                        dv_costs->dv_costs, MV_COST_WEIGHT_SUB);
    const int rate_mode = x->mode_costs.intrabc_cost[1];
    RD_STATS rd_stats_yuv, rd_stats_y, rd_stats_uv;
    if (!av1_txfm_search(cpi, x, bsize, &rd_stats_yuv, &rd_stats_y,
                         &rd_stats_uv, rate_mode + rate_mv, INT64_MAX))
      continue;
    rd_stats_yuv.rdcost =
        RDCOST(x->rdmult, rd_stats_yuv.rate, rd_stats_yuv.dist);
    if (rd_stats_yuv.rdcost < best_rd) {
      best_rd = rd_stats_yuv.rdcost;
      best_mbmi = *mbmi;
      best_rdstats = rd_stats_yuv;
      memcpy(best_blk_skip, txfm_info->blk_skip,
             sizeof(txfm_info->blk_skip[0]) * xd->height * xd->width);
      av1_copy_array(best_tx_type_map, xd->tx_type_map, xd->height * xd->width);
    }
  }
  *mbmi = best_mbmi;
  *rd_stats = best_rdstats;
  memcpy(txfm_info->blk_skip, best_blk_skip,
         sizeof(txfm_info->blk_skip[0]) * xd->height * xd->width);
  av1_copy_array(xd->tx_type_map, best_tx_type_map, ctx->num_4x4_blk);
#if CONFIG_RD_DEBUG
  mbmi->rd_stats = *rd_stats;
#endif
  return best_rd;
}